

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::PeekIsCustom(WastParser *this)

{
  bool bVar1;
  TokenType TVar2;
  int iVar3;
  string_view sVar4;
  
  if ((this->options_->features).annotations_enabled_ == true) {
    TVar2 = Peek(this,0);
    Peek(this,1);
    if (TVar2 != LparAnn) {
      return false;
    }
    bVar1 = (this->tokens_).i;
    if ((this->tokens_).tokens._M_elems[bVar1].super__Optional_base<wabt::Token,_true,_true>.
        _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    sVar4 = Token::text((Token *)((this->tokens_).tokens._M_elems + bVar1));
    if (sVar4._M_len == 6) {
      iVar3 = bcmp(sVar4._M_str,"custom",6);
      return iVar3 == 0;
    }
  }
  return false;
}

Assistant:

bool WastParser::PeekIsCustom() {
  // If IsLparAnn succeeds, tokens_.front() must have text, as it is an LparAnn
  // token.
  return options_->features.annotations_enabled() && IsLparAnn(PeekPair()) &&
         tokens_.front().text() == "custom";
}